

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpinGroup.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SpinGroup::~SpinGroup(SpinGroup *this)

{
  pointer pdVar1;
  
  std::
  vector<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
  ::~vector(&(this->background_).channels_);
  pdVar1 = (this->parameters_).super_ListRecord.data.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->parameters_).super_ListRecord.data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->channels_).super_ListRecord.data.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->channels_).super_ListRecord.data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
    return;
  }
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT SpinGroup  {

  /* fields */
  ResonanceChannels channels_;
  ResonanceParameters parameters_;
  BackgroundChannels background_;

  /* auxiliary functions */
  #include "ENDFtk/section/2/151/RMatrixLimited/SpinGroup/src/verify.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/2/151/RMatrixLimited/SpinGroup/src/ctor.hpp"

  /* methods */

  /**
   *  @brief Return the spin for this spin group
   */
  double AJ() const { return this->channels_.AJ(); }

  /**
   *  @brief Return the spin for this spin group
   */
  double spin() const { return this->AJ(); }

  /**
   *  @brief Return the parity for this spin group
   */
  double PJ() const { return this->channels_.PJ(); }

  /**
   *  @brief Return the parity for this spin group
   */
  double parity() const { return this->PJ(); }

  /**
   *  @brief Return the number of channels
   */
  auto NCH() const { return this->channels_.NCH(); }

  /**
   *  @brief Return the number of channels
   */
  auto numberChannels() const { return this->NCH(); }

  /**
   *  @brief Return the number of channels with background R-matrix values
   */
  auto KBK() const { return this->channels_.KBK(); }

  /**
   *  @brief Return the number of channels with background R-matrix values
   */
  auto numberBackgroundChannels() const { return this->NCH(); }

  /**
   *  @brief Return the number of resonances
   */
  auto NRS() const { return this->parameters_.NRS(); }

  /**
   *  @brief Return the number of resonances
   */
  auto numberResonances() const { return this->NRS(); }

  /**
   *  @brief Return the channel information
   */
  const ResonanceChannels& channels() const { return this->channels_; }

  /**
   *  @brief Return the resonance parameters for this spin group
   */
  const ResonanceParameters& parameters() const { return this->parameters_; }

  /**
   *  @brief Return the background R-matrix values for the spin group channels
   */
  const BackgroundChannels& background() const { return this->background_; }

  /**
   *  @brief Return the number of lines in this MF2 MT151 component
   */
  long NC() const { return this->channels_.NC() + this->parameters_.NC() +
                           this->background_.NC(); };

  #include "ENDFtk/section/2/151/RMatrixLimited/SpinGroup/src/print.hpp"
}